

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>_>::on_sign
          (specs_checker<fmt::v9::detail::specs_handler<char>_> *this,sign_t s)

{
  bool bVar1;
  sign_t s_local;
  specs_checker<fmt::v9::detail::specs_handler<char>_> *this_local;
  
  require_numeric_argument(this);
  bVar1 = is_integral_type(this->arg_type_);
  if ((((bVar1) && (this->arg_type_ != int_type)) && (this->arg_type_ != long_long_type)) &&
     ((this->arg_type_ != int128_type && (this->arg_type_ != char_type)))) {
    specs_handler<char>::on_error
              (&this->super_specs_handler<char>,"format specifier requires signed argument");
  }
  specs_setter<char>::on_sign((specs_setter<char> *)this,s);
  return;
}

Assistant:

FMT_CONSTEXPR void on_sign(sign_t s) {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != type::int_type &&
        arg_type_ != type::long_long_type && arg_type_ != type::int128_type &&
        arg_type_ != type::char_type) {
      this->on_error("format specifier requires signed argument");
    }
    Handler::on_sign(s);
  }